

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

Uint64 Diligent::PinWorkerThread(Uint32 ThreadId,Uint64 AllowedCoresMask)

{
  uint uVar1;
  ulong uVar2;
  Uint64 UVar3;
  char (*Args_1) [22];
  uint *in_R9;
  ulong uVar4;
  uint uVar5;
  string _msg;
  Uint32 WorkerCore;
  Uint32 ThreadId_local;
  Uint64 NumCores;
  Uint64 AllowedCoresMask_local;
  
  if (AllowedCoresMask != 0) {
    ThreadId_local = ThreadId;
    AllowedCoresMask_local = AllowedCoresMask;
    uVar1 = std::thread::hardware_concurrency();
    NumCores = (Uint64)uVar1;
    if (1 < uVar1) {
      uVar4 = ~(-1L << ((byte)uVar1 & 0x3f));
      if (0x3f < uVar1) {
        uVar4 = 0xffffffffffffffff;
      }
      uVar4 = uVar4 & AllowedCoresMask_local;
      if (uVar4 != 0) {
        uVar2 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
        uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
        Args_1 = (char (*) [22])
                 (((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        uVar5 = 0;
        uVar1 = (uint)((ulong)ThreadId_local % (ulong)Args_1);
        if (uVar1 != 0) {
          do {
            if (uVar4 == 0) {
              FormatString<char[26],char[18]>
                        (&_msg,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"AffinityMask != 0",(char (*) [18])Args_1);
              Args_1 = (char (*) [22])0x17d;
              DebugAssertionFailed
                        (_msg._M_dataplus._M_p,"PinWorkerThread",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                         ,0x17d);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_msg._M_dataplus._M_p != &_msg.field_2) {
                operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
              }
            }
            uVar4 = uVar4 - 1 & uVar4;
            uVar5 = uVar5 + 1;
          } while (uVar5 < uVar1);
        }
        if (uVar4 == 0) {
          FormatString<char[26],char[18]>
                    (&_msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"AffinityMask != 0",(char (*) [18])Args_1);
          Args_1 = (char (*) [22])0x182;
          DebugAssertionFailed
                    (_msg._M_dataplus._M_p,"PinWorkerThread",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                     ,0x182);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_msg._M_dataplus._M_p != &_msg.field_2) {
            operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
          }
        }
        if (uVar4 == 0) {
          uVar2 = 0x40;
        }
        else {
          uVar2 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
        }
        WorkerCore = (Uint32)uVar2;
        if (NumCores <= uVar2) {
          FormatString<char[26],char[22]>
                    (&_msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"WorkerCore < NumCores",Args_1);
          DebugAssertionFailed
                    (_msg._M_dataplus._M_p,"PinWorkerThread",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                     ,0x184);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_msg._M_dataplus._M_p != &_msg.field_2) {
            operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
          }
        }
        UVar3 = LinuxMisc::SetCurrentThreadAffinity(1L << ((byte)WorkerCore & 0x3f));
        if (UVar3 == 0) {
          FormatString<char[29],unsigned_int,char[10],unsigned_int>
                    (&_msg,(Diligent *)"Failed to pin worker thread ",(char (*) [29])&ThreadId_local
                     ,(uint *)" to core ",(char (*) [10])&WorkerCore,in_R9);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_msg._M_dataplus._M_p != &_msg.field_2) {
            operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
          }
        }
        return (ulong)(UVar3 != 0);
      }
      FormatString<char[23],std::ios_base&(std::ios_base&),unsigned_long,char[42],std::ios_base&(std::ios_base&),unsigned_long,char[17]>
                (&_msg,(Diligent *)"Allowed cores mask (0x",(char (*) [23])std::hex,
                 (_func_ios_base_ptr_ios_base_ptr *)&AllowedCoresMask_local,
                 (unsigned_long *)") does not set any bits corresponding to ",
                 (char (*) [42])std::dec,(_func_ios_base_ptr_ios_base_ptr *)&NumCores,
                 (unsigned_long *)" available cores",(char (*) [17])_msg._M_dataplus._M_p);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return 0;
}

Assistant:

Uint64 PinWorkerThread(Uint32 ThreadId, Uint64 AllowedCoresMask)
{
    if (AllowedCoresMask == 0)
    {
        return 0;
    }

    Uint64 NumCores = std::thread::hardware_concurrency();
    if (NumCores <= 1)
        return 0;

    Uint64 AffinityMask = AllowedCoresMask;
    if (NumCores < 64)
        AffinityMask &= (Uint64{1} << NumCores) - Uint64{1};

    if (AffinityMask == 0)
    {
        LOG_WARNING_MESSAGE("Allowed cores mask (0x", std::hex, AllowedCoresMask, ") does not set any bits corresponding to ", std::dec, NumCores, " available cores");
        return 0;
    }

    const Uint32 NumAllowedCores = PlatformMisc::CountOneBits(AffinityMask);
    const Uint32 CoreBitInd      = ThreadId % NumAllowedCores;

    for (Uint32 bit = 0; bit < CoreBitInd; ++bit)
    {
        VERIFY_EXPR(AffinityMask != 0);
        Uint64 LSB = PlatformMisc::GetLSB(AffinityMask);
        AffinityMask &= ~(Uint64{1} << LSB);
    }

    VERIFY_EXPR(AffinityMask != 0);
    Uint32 WorkerCore = PlatformMisc::GetLSB(AffinityMask);
    VERIFY_EXPR(WorkerCore < NumCores);
    Uint64 PrevMask = PlatformMisc::SetCurrentThreadAffinity(Uint64{1} << WorkerCore) != 0;
    if (PrevMask == 0)
    {
        LOG_WARNING_MESSAGE("Failed to pin worker thread ", ThreadId, " to core ", WorkerCore);
    }

    return PrevMask;
}